

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
          *f)

{
  uint uVar1;
  alignment aVar2;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *this_00;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *pbVar3;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar4;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
  *in_RDX;
  align_spec *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff58;
  wchar_t *in_stack_ffffffffffffff78;
  unsigned_long in_stack_ffffffffffffff80;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_stack_ffffffffffffff88;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
  *in_stack_ffffffffffffff90;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
  *this_01;
  
  uVar1 = align_spec::width(in_RSI);
  this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             *)basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
               ::
               padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
               ::size(in_RDX);
  if (uVar1 != 0) {
    this_00 = (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
               *)basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ::
                 padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
                 ::width(in_RDX);
  }
  if (this_00 < (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 *)(ulong)uVar1) {
    pbVar3 = basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             ::reserve(this_00,in_stack_ffffffffffffff58);
    align_spec::fill(in_RSI);
    aVar2 = align_spec::align(in_RSI);
    if (aVar2 == ALIGN_RIGHT) {
      bVar4 = std::
              fill_n<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                        (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         in_stack_ffffffffffffff78);
      pbVar3->container = bVar4.container;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
      ::operator()(in_stack_ffffffffffffff90,
                   (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                   in_stack_ffffffffffffff88.container);
    }
    else {
      aVar2 = align_spec::align(in_RSI);
      if (aVar2 == ALIGN_CENTER) {
        this_01 = (padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>::int_writer<long_long,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
                   *)pbVar3->container;
        bVar4 = std::
                fill_n<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78);
        pbVar3->container = bVar4.container;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
        ::operator()(this_01,(back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>
                              *)in_stack_ffffffffffffff88.container);
        bVar4 = std::
                fill_n<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                          (in_stack_ffffffffffffff88,(unsigned_long)pbVar3->container,
                           in_stack_ffffffffffffff78);
        pbVar3->container = bVar4.container;
      }
      else {
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
        ::operator()(in_stack_ffffffffffffff90,
                     (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                     in_stack_ffffffffffffff88.container);
        bVar4 = std::
                fill_n<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long,wchar_t>
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78);
        pbVar3->container = bVar4.container;
      }
    }
  }
  else {
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
    ::reserve(this_00,(size_t)in_RDX);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
    ::operator()(in_stack_ffffffffffffff90,
                 (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
                 in_stack_ffffffffffffff88.container);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }